

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void parserDoubleLinkSelect(Parse *pParse,Select *p)

{
  byte *pbVar1;
  int iVar2;
  Select *pSVar3;
  byte bVar4;
  Select *pSVar5;
  char *pcVar6;
  char *pcVar7;
  Select *pSVar8;
  int iVar9;
  
  if (p->pPrior != (Select *)0x0) {
    pcVar7 = "ORDER BY";
    pSVar5 = (Select *)0x0;
    pSVar3 = p;
    iVar2 = 1;
    do {
      iVar9 = iVar2;
      pSVar8 = pSVar3;
      pSVar8->pNext = pSVar5;
      pbVar1 = (byte *)((long)&pSVar8->selFlags + 1);
      *pbVar1 = *pbVar1 | 1;
      pSVar3 = pSVar8->pPrior;
      if (pSVar3 == (Select *)0x0) goto LAB_00159eda;
      if (pSVar3->pOrderBy != (ExprList *)0x0) goto LAB_00159ea7;
      pSVar5 = pSVar8;
      iVar2 = iVar9 + 1;
    } while (pSVar3->pLimit == (Expr *)0x0);
    pcVar7 = "LIMIT";
LAB_00159ea7:
    bVar4 = pSVar8->op + 0x79;
    if (bVar4 < 3) {
      pcVar6 = (&PTR_anon_var_dwarf_3383d_001ccd88)[bVar4];
    }
    else {
      pcVar6 = "UNION";
    }
    iVar9 = iVar9 + 1;
    sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",pcVar7,pcVar6);
LAB_00159eda:
    if ((((p->selFlags & 0x400) == 0) && (iVar2 = pParse->db->aLimit[4], 0 < iVar2)) &&
       (iVar2 < iVar9)) {
      sqlite3ErrorMsg(pParse,"too many terms in compound SELECT");
      return;
    }
  }
  return;
}

Assistant:

static void parserDoubleLinkSelect(Parse *pParse, Select *p){
    assert( p!=0 );
    if( p->pPrior ){
      Select *pNext = 0, *pLoop = p;
      int mxSelect, cnt = 1;
      while(1){
        pLoop->pNext = pNext;
        pLoop->selFlags |= SF_Compound;
        pNext = pLoop;
        pLoop = pLoop->pPrior;
        if( pLoop==0 ) break;
        cnt++;
        if( pLoop->pOrderBy || pLoop->pLimit ){
          sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",
             pLoop->pOrderBy!=0 ? "ORDER BY" : "LIMIT",
             sqlite3SelectOpName(pNext->op));
          break;
        }
      }
      if( (p->selFlags & SF_MultiValue)==0 &&
        (mxSelect = pParse->db->aLimit[SQLITE_LIMIT_COMPOUND_SELECT])>0 &&
        cnt>mxSelect
      ){
        sqlite3ErrorMsg(pParse, "too many terms in compound SELECT");
      }
    }
  }